

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O2

Method __thiscall webfront::http::Request::getMethodFromString(Request *this,string_view text)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  array<const_char_*,_9UL> *paVar3;
  size_t index;
  long lVar4;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  __x._M_str = (char *)text._M_len;
  paVar3 = &methodNames;
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 9) {
      return Undefined;
    }
    __s = paVar3->_M_elems[0];
    sVar2 = strlen(__s);
    __x._M_len = (size_t)this;
    __y._M_str = __s;
    __y._M_len = sVar2;
    bVar1 = ::std::operator==(__x,__y);
    if (bVar1) break;
    lVar4 = lVar4 + 1;
    paVar3 = (array<const_char_*,_9UL> *)((long)paVar3 + 8);
  }
  return (Method)lVar4;
}

Assistant:

[[nodiscard]] static Method getMethodFromString(std::string_view text) {
        for (size_t index = 0; index < methodNames.size(); ++index)
            if (methodNames[index] == text) return static_cast<Method>(index);
        return Method::Undefined;
    }